

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb_asnmth.c
# Opt level: O0

void engine_pkey_asn1_meths_free(ENGINE *e)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  int npknids;
  int *pknids;
  EVP_PKEY_ASN1_METHOD *pkm;
  int i;
  long local_20;
  EVP_PKEY_ASN1_METHOD *local_18;
  int local_c;
  long local_8;
  
  if (*(long *)(in_RDI + 0x50) != 0) {
    local_8 = in_RDI;
    iVar1 = (**(code **)(in_RDI + 0x50))(in_RDI,0,&local_20,0);
    for (local_c = 0; local_c < iVar1; local_c = local_c + 1) {
      iVar2 = (**(code **)(local_8 + 0x50))
                        (local_8,&local_18,0,*(undefined4 *)(local_20 + (long)local_c * 4));
      if (iVar2 != 0) {
        EVP_PKEY_asn1_free(local_18);
      }
    }
  }
  return;
}

Assistant:

void engine_pkey_asn1_meths_free(ENGINE *e)
{
    int i;
    EVP_PKEY_ASN1_METHOD *pkm;
    if (e->pkey_asn1_meths) {
        const int *pknids;
        int npknids;
        npknids = e->pkey_asn1_meths(e, NULL, &pknids, 0);
        for (i = 0; i < npknids; i++) {
            if (e->pkey_asn1_meths(e, &pkm, NULL, pknids[i])) {
                EVP_PKEY_asn1_free(pkm);
            }
        }
    }
}